

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQFunctionProto::Mark(SQFunctionProto *this,SQCollectable **chain)

{
  SQCollectable_conflict **in_RSI;
  SQCollectable_conflict *in_RDI;
  SQInteger k;
  SQInteger i;
  SQObjectPtr *in_stack_ffffffffffffffe0;
  byte *o;
  long local_18;
  
  if (((in_RDI->super_SQRefCounted)._uiRef & 0x80000000) == 0) {
    (in_RDI->super_SQRefCounted)._uiRef = (in_RDI->super_SQRefCounted)._uiRef | 0x80000000;
    for (local_18 = 0; local_18 < (long)in_RDI[2]._sharedstate; local_18 = local_18 + 1) {
      SQSharedState::MarkObject(in_stack_ffffffffffffffe0,(SQCollectable_conflict **)in_RDI);
    }
    for (o = (byte *)0x0; (long)o < (long)in_RDI[3]._next;
        o = (byte *)((long)&(((SQObjectPtr *)o)->super_SQObject)._type + 1)) {
      SQSharedState::MarkObject((SQObjectPtr *)o,(SQCollectable_conflict **)in_RDI);
    }
    SQCollectable::RemoveFromChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
    SQCollectable::AddToChain(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void SQFunctionProto::Mark(SQCollectable **chain)
{
    START_MARK()
        for(SQInteger i = 0; i < _nliterals; i++) SQSharedState::MarkObject(_literals[i], chain);
        for(SQInteger k = 0; k < _nfunctions; k++) SQSharedState::MarkObject(_functions[k], chain);
    END_MARK()
}